

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O2

wchar_t * archive_entry_acl_text_w(archive_entry *entry,wchar_t flags)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  wchar_t local_c;
  
  pwVar2 = (entry->acl).acl_text_w;
  local_c = flags;
  if (pwVar2 != (wchar_t *)0x0) {
    free(pwVar2);
    (entry->acl).acl_text_w = (wchar_t *)0x0;
  }
  wVar1 = archive_entry_acl_text_compat(&local_c);
  if (wVar1 == L'\0') {
    pwVar2 = archive_acl_to_text_w(&entry->acl,(ssize_t *)0x0,local_c,entry->archive);
    (entry->acl).acl_text_w = pwVar2;
  }
  else {
    pwVar2 = (wchar_t *)0x0;
  }
  return pwVar2;
}

Assistant:

const wchar_t *
archive_entry_acl_text_w(struct archive_entry *entry, int flags)
{
	if (entry->acl.acl_text_w != NULL) {
		free(entry->acl.acl_text_w);
		entry->acl.acl_text_w = NULL;
	}
	if (archive_entry_acl_text_compat(&flags) == 0)
		entry->acl.acl_text_w = archive_acl_to_text_w(&entry->acl,
		    NULL, flags, entry->archive);
	return (entry->acl.acl_text_w);
}